

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void PrintType(InstructionVMGraphContext *ctx,VmType type)

{
  uint uVar1;
  VmValueType VVar2;
  char *format;
  
  VVar2 = type.type;
  uVar1 = type.size;
  if ((VVar2 == VM_TYPE_VOID) && (uVar1 == 0)) {
    format = "void";
  }
  else if ((VVar2 == VM_TYPE_INT) && (uVar1 == 4)) {
    format = "int";
  }
  else if ((VVar2 == VM_TYPE_DOUBLE) && (uVar1 == 8)) {
    format = "double";
  }
  else if ((VVar2 == VM_TYPE_LONG) && (uVar1 == 8)) {
    format = "long";
  }
  else if ((VVar2 == VM_TYPE_BLOCK) && (uVar1 == 4)) {
    format = "label";
  }
  else if ((VVar2 == VM_TYPE_FUNCTION) && (uVar1 == 4)) {
    format = "function";
  }
  else if (VVar2 == VM_TYPE_ARRAY_REF) {
    format = "array_ref";
  }
  else if (VVar2 == VM_TYPE_FUNCTION_REF) {
    format = "func_ref";
  }
  else if (VVar2 == VM_TYPE_POINTER) {
    format = "ptr";
  }
  else if ((VVar2 == VM_TYPE_AUTO_REF) && (uVar1 == 0xc)) {
    format = "auto ref";
  }
  else {
    if ((VVar2 != VM_TYPE_AUTO_ARRAY) || (uVar1 != 0x10)) {
      if (VVar2 == VM_TYPE_STRUCT) {
        Print(ctx,"%.*s",
              (ulong)(uint)(*(int *)&((type.structType)->name).end -
                           (int)((type.structType)->name).begin));
        return;
      }
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                    ,0x54,"void PrintType(InstructionVMGraphContext &, VmType)");
    }
    format = "auto[]";
  }
  Print(ctx,format);
  return;
}

Assistant:

void PrintType(InstructionVMGraphContext &ctx, VmType type)
{
	if(type == VmType::Void)
		Print(ctx, "void");
	else if(type == VmType::Int)
		Print(ctx, "int");
	else if(type == VmType::Double)
		Print(ctx, "double");
	else if(type == VmType::Long)
		Print(ctx, "long");
	else if(type == VmType::Block)
		Print(ctx, "label");
	else if(type == VmType::Function)
		Print(ctx, "function");
	else if(type.type == VM_TYPE_POINTER)
		Print(ctx, "ptr");
	else if(type.type == VM_TYPE_FUNCTION_REF)
		Print(ctx, "func_ref");
	else if(type.type == VM_TYPE_ARRAY_REF)
		Print(ctx, "array_ref");
	else if(type == VmType::AutoRef)
		Print(ctx, "auto ref");
	else if(type == VmType::AutoArray)
		Print(ctx, "auto[]");
	else if(type.type == VM_TYPE_STRUCT)
		Print(ctx, "%.*s", FMT_ISTR(type.structType->name));
	else
		assert(!"unknown type");
}